

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O2

int get_rect_ind(nhrect *r)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0;
      (iVar1 = -1, (int)lVar2 < rect_cnt &&
      ((((r->lx != rect[lVar2].lx || (r->ly != rect[lVar2].ly)) || (r->hx != rect[lVar2].hx)) ||
       (iVar1 = (int)lVar2, r->hy != rect[lVar2].hy)))); lVar2 = lVar2 + 1) {
  }
  return iVar1;
}

Assistant:

int get_rect_ind(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx == rectp->lx && ly == rectp->ly &&
		 hx == rectp->hx && hy == rectp->hy)
		return i;
	return -1;
}